

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.tab.hh
# Opt level: O0

void __thiscall
tchecker::parsing::system::parser_t::value_type::move<int>(value_type *this,self_type *that)

{
  int *u;
  self_type *that_local;
  value_type *this_local;
  
  u = as<int>(that);
  emplace<int,int>(this,u);
  destroy<int>(that);
  return;
}

Assistant:

void
    move (self_type&& that)
    {
      emplace<T> (std::move (that.as<T> ()));
      that.destroy<T> ();
    }